

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall
QCompleterPrivate::_q_completionSelected(QCompleterPrivate *this,QItemSelection *selection)

{
  long lVar1;
  QModelIndex index;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QItemSelection::indexes();
  tVar5.ptr = _DAT_aaaaaaaaaaaaaaba;
  uVar4 = _DAT_aaaaaaaaaaaaaab2;
  uVar3 = _DAT_aaaaaaaaaaaaaaae;
  iVar2 = _DAT_aaaaaaaaaaaaaaaa;
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
  }
  index.c = uVar3;
  index.r = iVar2;
  index.i = uVar4;
  index.m.ptr = tVar5.ptr;
  _q_complete(this,index,true);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleterPrivate::_q_completionSelected(const QItemSelection& selection)
{
    QModelIndex index;
    if (const auto indexes = selection.indexes(); !indexes.isEmpty())
        index = indexes.first();

    _q_complete(index, true);
}